

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O1

void __thiscall
Js::StringProfiler::RecordConcatenation
          (StringProfiler *this,uint lenLeft,uint lenRight,ConcatType type)

{
  bool bVar1;
  ThreadContextId pvVar2;
  UintUintPair local_48;
  UintUintPair key;
  ConcatMetrics *metrics;
  int i;
  uint uStack_2c;
  
  pvVar2 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar2 == this->mainThreadId) {
    local_48.first = lenLeft;
    if (0x13 < lenLeft) {
      local_48.first = 0x14;
    }
    local_48.second = 0x14;
    if (lenRight < 0x14) {
      local_48.second = lenRight;
    }
    bVar1 = JsUtil::
            BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<Js::StringProfiler::UintUintPair>
                      (&this->stringConcatMetrics,&local_48,(ConcatMetrics **)&key,(int *)&metrics);
    if (bVar1) {
      ConcatMetrics::Accumulate((ConcatMetrics *)key,type);
    }
    else {
      metrics = (ConcatMetrics *)0x0;
      i = 0;
      uStack_2c = 0;
      switch(type) {
      case ConcatType_Unknown:
        i = 0;
        uStack_2c = 1;
        break;
      case ConcatType_CompoundString:
        metrics = (ConcatMetrics *)&DAT_00000001;
        break;
      case ConcatType_ConcatTree:
        metrics = (ConcatMetrics *)0x100000000;
        break;
      case ConcatType_BufferString:
        i = 1;
        uStack_2c = 0;
      }
      JsUtil::
      BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&this->stringConcatMetrics,&local_48,(ConcatMetrics *)&metrics);
    }
  }
  return;
}

Assistant:

void StringProfiler::RecordConcatenation( uint lenLeft, uint lenRight, ConcatType type )
    {
        if( IsOnWrongThread() )
        {
            return;
        }

        lenLeft = min( lenLeft, k_MaxConcatLength );
        lenRight = min( lenRight, k_MaxConcatLength );

        UintUintPair key = { lenLeft, lenRight };
        ConcatMetrics* metrics;
        if(!stringConcatMetrics.TryGetReference(key, &metrics))
        {
            stringConcatMetrics.Add(key, ConcatMetrics(type));
        }
        else
        {
            metrics->Accumulate(type);
        }
    }